

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::InstanceArrayISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,InstanceArrayISA *this,PrimRef *prims,BBox1f *time_range
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined4 uVar1;
  LBBox3fa *pLVar2;
  ulong instance;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  BBox1f BVar7;
  undefined1 auVar8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  LBBox3fa lbounds;
  BBox1f local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  PrimRef *local_88;
  BBox1f *local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  local_88 = prims;
  BVar7 = Geometry::getTimeRange((Geometry *)this);
  fVar10 = (*time_range).lower;
  fVar13 = (*time_range).upper;
  uVar5 = -(uint)(BVar7.lower < fVar10);
  uVar6 = -(uint)(BVar7.upper < fVar13);
  local_d0 = (BBox1f)(CONCAT44(~uVar6 & (uint)fVar13,~uVar5 & (uint)BVar7.lower) |
                     CONCAT44((uint)BVar7.upper & uVar6,(uint)fVar10 & uVar5));
  if (local_d0.lower <= local_d0.upper) {
    instance = r->_begin;
    local_98 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                lower.field_0.m128;
    local_a8 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                upper.field_0.m128;
    local_b8 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                lower.field_0.m128;
    local_c8 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                upper.field_0.m128;
    sVar4 = __return_storage_ptr__->end;
    if (instance < r->_end) {
      local_80 = &(this->super_InstanceArray).super_Geometry.time_range;
      do {
        if ((*(long *)&(this->super_InstanceArray).super_Geometry.field_0x58 != 0) ||
           (pLVar2 = (LBBox3fa *)(this->super_InstanceArray).object_ids.super_RawBufferView.ptr_ofs,
           ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)
           ((long)&(pLVar2->bounds0).lower.field_0 +
           (this->super_InstanceArray).object_ids.super_RawBufferView.stride * instance))->m128[0]
           != -NAN)) {
          pLVar2 = InstanceArray::nonlinearBounds
                             ((LBBox3fa *)&local_78.field_1,&this->super_InstanceArray,instance,
                              &local_d0,local_80,
                              (this->super_InstanceArray).super_Geometry.fnumTimeSegments);
        }
        auVar8 = minps((undefined1  [16])local_78,local_58);
        auVar11 = maxps(local_68,local_48);
        auVar15._0_4_ = -(uint)(auVar11._0_4_ < 1.844e+18 && -1.844e+18 < auVar8._0_4_);
        auVar15._4_4_ = -(uint)(auVar11._4_4_ < 1.844e+18 && -1.844e+18 < auVar8._4_4_);
        auVar15._8_4_ = -(uint)(auVar11._8_4_ < 1.844e+18 && -1.844e+18 < auVar8._8_4_);
        auVar15._12_4_ = -(uint)(auVar11._12_4_ < 1.844e+18 && -1.844e+18 < auVar8._12_4_);
        uVar1 = movmskps((int)pLVar2,auVar15);
        sVar3 = k;
        if ((~(byte)uVar1 & 7) == 0) {
          aVar9._0_12_ = auVar8._0_12_;
          aVar9.m128[3] = (float)geomID;
          aVar12._0_12_ = auVar11._0_12_;
          aVar12.m128[3] = (float)instance;
          local_98 = minps(local_98,(undefined1  [16])aVar9);
          local_a8 = maxps(local_a8,(undefined1  [16])aVar12);
          auVar14._0_4_ = auVar8._0_4_ + auVar11._0_4_;
          auVar14._4_4_ = auVar8._4_4_ + auVar11._4_4_;
          auVar14._8_4_ = auVar8._8_4_ + auVar11._8_4_;
          auVar14._12_4_ = (float)geomID + (float)instance;
          local_b8 = minps(local_b8,auVar14);
          local_c8 = maxps(local_c8,auVar14);
          sVar4 = sVar4 + 1;
          sVar3 = k + 1;
          local_88[k].lower.field_0 = aVar9;
          local_88[k].upper.field_0 = aVar12;
        }
        instance = instance + 1;
        k = sVar3;
      } while (instance < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_98._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_98._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_c8._8_8_;
    __return_storage_ptr__->end = sVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;

        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = linearBounds(j, t0t1);
          if (!isvalid(lbounds.bounds()))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }